

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O2

void __thiscall wasm::Instrumenter::addSecondaryMemory(Instrumenter *this,size_t numFuncs)

{
  char *pcVar1;
  string_view sVar2;
  Name name;
  undefined1 local_1a8 [8];
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> mem;
  
  if (this->config->storageKind == InSecondaryMemory) {
    if (((this->wasm->features).features & 0x8000) == 0) {
      Fatal::Fatal((Fatal *)local_1a8);
      Fatal::operator<<((Fatal *)local_1a8,
                        (char (*) [64])
                        "error: --in-secondary-memory requires multimemory to be enabled");
      Fatal::~Fatal((Fatal *)local_1a8);
    }
    sVar2 = (string_view)
            Names::getValidMemoryName
                      (this->wasm,(Name)(this->config->secondaryMemoryName).super_IString.str);
    (this->secondaryMemory).super_IString.str = sVar2;
    name.super_IString.str._M_str = (char *)sVar2._M_len;
    name.super_IString.str._M_len = (size_t)local_1a8;
    Builder::makeMemory(name,(Address)sVar2._M_str,(Address)(numFuncs + 0xffff >> 0x10),
                        SUB81(numFuncs + 0xffff >> 0x10,0),(Type)0x1);
    pcVar1 = (this->config->importNamespace).super_IString.str._M_str;
    *(size_t *)((long)local_1a8 + 0x18) = (this->config->importNamespace).super_IString.str._M_len;
    *(char **)((long)local_1a8 + 0x20) = pcVar1;
    pcVar1 = (this->config->secondaryMemoryName).super_IString.str._M_str;
    *(size_t *)((long)local_1a8 + 0x28) =
         (this->config->secondaryMemoryName).super_IString.str._M_len;
    *(char **)((long)local_1a8 + 0x30) = pcVar1;
    wasm::Module::addMemory((unique_ptr *)this->wasm);
    std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr
              ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)local_1a8);
  }
  return;
}

Assistant:

void Instrumenter::addSecondaryMemory(size_t numFuncs) {
  if (config.storageKind != WasmSplitOptions::StorageKind::InSecondaryMemory) {
    // Don't need secondary memory
    return;
  }
  if (!wasm->features.hasMultiMemory()) {
    Fatal()
      << "error: --in-secondary-memory requires multimemory to be enabled";
  }

  secondaryMemory =
    Names::getValidMemoryName(*wasm, config.secondaryMemoryName);
  // Create a memory with enough pages to write into
  size_t pages = (numFuncs + Memory::kPageSize - 1) / Memory::kPageSize;
  auto mem = Builder::makeMemory(secondaryMemory, pages, pages, true);
  mem->module = config.importNamespace;
  mem->base = config.secondaryMemoryName;
  wasm->addMemory(std::move(mem));
}